

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O2

void __thiscall FConsoleBuffer::FormatText(FConsoleBuffer *this,FFont *formatfont,int displaywidth)

{
  TArray<FBrokenLines_*,_FBrokenLines_*> *this_00;
  TArray<unsigned_int,_unsigned_int> *this_01;
  uint uVar1;
  uint i;
  ulong uVar2;
  FBrokenLines *bl;
  uint local_3c;
  FFont *local_38;
  
  local_38 = formatfont;
  if (((this->mLastFont != formatfont) || (this->mLastDisplayWidth != displaywidth)) ||
     (this->mBufferWasCleared == true)) {
    FreeBrokenText(this,0,0x7fffffff);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Clear(&this->mBrokenConsoleText);
    TArray<unsigned_int,_unsigned_int>::Clear(&this->mBrokenStart);
    bl = (FBrokenLines *)((ulong)bl._4_4_ << 0x20);
    TArray<unsigned_int,_unsigned_int>::Push(&this->mBrokenStart,(uint *)&bl);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Clear(&this->mBrokenLines);
    this->mLastFont = local_38;
    this->mLastDisplayWidth = displaywidth;
    this->mBufferWasCleared = false;
  }
  this_00 = &this->mBrokenConsoleText;
  uVar1 = (this->mBrokenConsoleText).Count;
  uVar2 = (ulong)uVar1;
  if ((uVar1 == (this->mConsoleText).Count) && (this->mLastLineNeedsUpdate == true)) {
    uVar2 = (ulong)(uVar1 - 1);
    V_FreeBrokenLines(this_00->Array[uVar2]);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Resize(this_00,uVar1 - 1);
  }
  this_01 = &this->mBrokenStart;
  TArray<FBrokenLines_*,_FBrokenLines_*>::Resize
            (&this->mBrokenLines,(this->mBrokenStart).Array[uVar2]);
  TArray<unsigned_int,_unsigned_int>::Resize(this_01,(uint)uVar2);
  for (; uVar2 < (this->mConsoleText).Count; uVar2 = uVar2 + 1) {
    bl = V_BreakLines(local_38,displaywidth,(this->mConsoleText).Array + uVar2,true);
    TArray<FBrokenLines_*,_FBrokenLines_*>::Push(this_00,&bl);
    local_3c = (this->mBrokenLines).Count;
    TArray<unsigned_int,_unsigned_int>::Push(this_01,&local_3c);
    for (; bl->Width != -1; bl = bl + 1) {
      TArray<FBrokenLines_*,_FBrokenLines_*>::Push(&this->mBrokenLines,&bl);
    }
  }
  uVar1 = (this->mBrokenLines).Count;
  this->mTextLines = uVar1;
  bl = (FBrokenLines *)CONCAT44(bl._4_4_,uVar1);
  TArray<unsigned_int,_unsigned_int>::Push(this_01,(uint *)&bl);
  this->mLastLineNeedsUpdate = false;
  return;
}

Assistant:

void FConsoleBuffer::FormatText(FFont *formatfont, int displaywidth)
{
	if (formatfont != mLastFont || displaywidth != mLastDisplayWidth || mBufferWasCleared)
	{
		FreeBrokenText();
		mBrokenConsoleText.Clear();
		mBrokenStart.Clear();
		mBrokenStart.Push(0);
		mBrokenLines.Clear();
		mLastFont = formatfont;
		mLastDisplayWidth = displaywidth;
		mBufferWasCleared = false;
	}
	unsigned brokensize = mBrokenConsoleText.Size();
	if (brokensize == mConsoleText.Size())
	{
		// The last line got text appended. We have to wait until here to format it because
		// it is possible that during display new text will be added from the NetUpdate calls in the software version of DrawTextureV.
		if (mLastLineNeedsUpdate)
		{
			brokensize--;
			V_FreeBrokenLines(mBrokenConsoleText[brokensize]);
			mBrokenConsoleText.Resize(brokensize);
		}
	}
	mBrokenLines.Resize(mBrokenStart[brokensize]);
	mBrokenStart.Resize(brokensize);
	for (unsigned i = brokensize; i < mConsoleText.Size(); i++)
	{
		FBrokenLines *bl = V_BreakLines(formatfont, displaywidth, mConsoleText[i], true);
		mBrokenConsoleText.Push(bl);
		mBrokenStart.Push(mBrokenLines.Size());
		while (bl->Width != -1)
		{
			mBrokenLines.Push(bl);
			bl++;
		}
	}
	mTextLines = mBrokenLines.Size();
	mBrokenStart.Push(mTextLines);
	mLastLineNeedsUpdate = false;
}